

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

void conf_del_str_str(Conf *conf,int primary,char *secondary)

{
  conf_entry *entry_00;
  conf_entry *entry;
  key key;
  char *secondary_local;
  int primary_local;
  Conf *conf_local;
  
  key.secondary.s = secondary;
  if (subkeytypes[primary] != 3) {
    __assert_fail("subkeytypes[primary] == TYPE_STR",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x1d6,"void conf_del_str_str(Conf *, int, const char *)");
  }
  if (valuetypes[primary] == 3) {
    entry._0_4_ = primary;
    key._0_8_ = secondary;
    entry_00 = (conf_entry *)find234(conf->tree,&entry,(cmpfn234)0x0);
    if (entry_00 != (conf_entry *)0x0) {
      del234(conf->tree,entry_00);
      free_entry(entry_00);
    }
    return;
  }
  __assert_fail("valuetypes[primary] == TYPE_STR",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x1d7,"void conf_del_str_str(Conf *, int, const char *)");
}

Assistant:

void conf_del_str_str(Conf *conf, int primary, const char *secondary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_STR);
    assert(valuetypes[primary] == TYPE_STR);
    key.primary = primary;
    key.secondary.s = (char *)secondary;
    entry = find234(conf->tree, &key, NULL);
    if (entry) {
        del234(conf->tree, entry);
        free_entry(entry);
    }
 }